

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O1

vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> * __thiscall
Blob_Detection::BlobDetection::find
          (BlobDetection *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
          BlobParameters parameter,uint8_t threshold)

{
  pointer *ppuVar1;
  pointer *this_00;
  iterator iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  BlobDetection *pBVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  size_t siglen;
  pointer puVar7;
  undefined4 in_register_00000014;
  uchar *sig;
  uchar *puVar8;
  iterator __j;
  pointer pBVar9;
  pointer pBVar10;
  pointer pBVar11;
  uint uVar12;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  ulong uVar14;
  uint32_t uVar15;
  undefined4 in_register_0000008c;
  uchar *puVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  char cVar21;
  uint local_1e0;
  uint local_1dc;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_1d8;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_1d0;
  undefined1 local_1c8 [112];
  undefined1 local_158 [40];
  undefined8 uStack_130;
  void *pvStack_128;
  double dStack_120;
  double local_118;
  void *pvStack_110;
  double dStack_108;
  undefined8 uStack_100;
  void *pvStack_f8;
  undefined8 uStack_f0;
  Value<unsigned_int> VStack_e8;
  void *pvStack_e0;
  undefined8 local_d8;
  Value<unsigned_int> VStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  BlobDetection *local_50;
  pointer local_48;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_40;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  local_1c8._48_8_ = CONCAT44(in_register_00000014,x);
  local_1c8._56_8_ = CONCAT44(in_register_0000000c,y);
  ctx = (EVP_PKEY_CTX *)(ulong)x;
  siglen = (size_t)width;
  puVar8 = (uchar *)(ulong)height;
  uVar15 = height;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  BlobParameters::_verify(&parameter,ctx,sig,siglen,puVar8,CONCAT44(in_register_0000008c,uVar15));
  std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_erase_at_end
            (&this->_blob,
             (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_1c8._24_8_ = ZEXT48(width + 2);
  local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1c8 + 0x58),
             (ulong)((height + 2) * (width + 2)),local_1c8 + 0x70,(allocator_type *)local_1c8);
  uVar6 = image->_rowSize;
  uVar17 = (ulong)width;
  if (height * uVar6 != 0) {
    puVar8 = image->_data + (local_1c8._48_8_ & 0xffffffff) + (ulong)(uVar6 * local_1c8._56_4_);
    puVar16 = puVar8 + height * uVar6;
    lVar13 = CONCAT44(local_1c8._92_4_,local_1c8._88_4_) + 1;
    do {
      lVar13 = lVar13 + local_1c8._24_8_;
      if (width != 0) {
        uVar14 = 0;
        do {
          if (threshold <= puVar8[uVar14]) {
            *(undefined1 *)(lVar13 + uVar14) = 1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar17 != uVar14);
      }
      puVar8 = puVar8 + uVar6;
    } while (puVar8 != puVar16);
  }
  local_1c8._16_8_ = (pointer)0x0;
  puVar7 = (pointer)(CONCAT44(local_1c8._92_4_,local_1c8._88_4_) + local_1c8._24_8_);
  local_48 = (pointer)(local_1c8._96_8_ - local_1c8._24_8_);
  local_1c8._0_8_ = (pointer)local_1c8;
  local_1c8._8_8_ = (pointer)local_1c8;
  local_50 = this;
  if (puVar7 != local_48) {
    local_1c8._64_8_ = -local_1c8._24_8_;
    local_1c8._80_4_ = (int)local_1c8._48_8_ + -1;
    local_1c8._76_4_ = local_1c8._56_4_ + -1;
    do {
      local_1c8._40_8_ = puVar7;
      if ((char)*puVar7 == '\x01') {
        local_98 = 0;
        uStack_90 = 0;
        uStack_88 = 0;
        uStack_80 = 0;
        uStack_78 = 0;
        uStack_70 = 0;
        uStack_68 = 0;
        uStack_60 = 0;
        local_d8._0_1_ = false;
        local_d8._1_7_ = 0;
        VStack_d0.value = 0;
        VStack_d0.found = false;
        VStack_d0._5_3_ = 0;
        uStack_c8 = 0;
        uStack_c0 = 0;
        uStack_b8 = 0;
        uStack_b0 = 0;
        uStack_a8 = 0;
        uStack_a0 = 0;
        local_118 = 0.0;
        pvStack_110 = (void *)0x0;
        dStack_108 = 0.0;
        uStack_100._0_1_ = false;
        uStack_100._1_7_ = 0;
        pvStack_f8 = (void *)0x0;
        uStack_f0._0_1_ = false;
        uStack_f0._1_7_ = 0;
        VStack_e8.value = 0;
        VStack_e8.found = false;
        VStack_e8._5_3_ = 0;
        pvStack_e0 = (void *)0x0;
        local_158._0_8_ = (pointer)0x0;
        local_158._8_8_ = (pointer)0x0;
        local_158._16_8_ = (pointer)0x0;
        local_158._24_8_ = (pointer)0x0;
        local_158._32_4_ = 0;
        local_158._36_4_ = 0;
        uStack_130._0_4_ = 0;
        uStack_130._4_4_ = 0;
        pvStack_128 = (void *)0x0;
        dStack_120 = 0.0;
        std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
        _M_insert<Blob_Detection::BlobInfo>
                  ((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                   local_1c8,(iterator)local_1c8,(BlobInfo *)(local_1c8 + 0x70));
        uVar4 = local_1c8._40_8_;
        if (pvStack_e0 != (void *)0x0) {
          operator_delete(pvStack_e0);
        }
        if (pvStack_f8 != (void *)0x0) {
          operator_delete(pvStack_f8);
        }
        if (pvStack_110 != (void *)0x0) {
          operator_delete(pvStack_110);
        }
        if (pvStack_128 != (void *)0x0) {
          operator_delete(pvStack_128);
        }
        if ((pointer)local_158._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._24_8_);
        }
        if ((pointer)local_158._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._0_8_);
        }
        uVar3 = local_1c8._8_8_;
        uVar6 = (int)uVar4 - local_1c8._88_4_;
        uVar12 = uVar6 / (uint)local_1c8._24_4_;
        ppuVar1 = &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8._8_8_)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_1c8._84_4_ = uVar6 % (uint)local_1c8._24_4_ + local_1c8._80_4_;
        local_158._0_4_ = local_1c8._84_4_;
        iVar2._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1c8._8_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar2._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1c8._8_8_ + 0x18))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                     (uint *)(local_1c8 + 0x70));
        }
        else {
          *iVar2._M_current = local_1c8._84_4_;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1c8._8_8_ + 0x18))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar2._M_current + 1;
        }
        this_00 = &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_1c8._36_4_ = uVar12 + local_1c8._76_4_;
        local_158._0_4_ = local_1c8._36_4_;
        iVar2._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar2._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar2,
                     (uint *)(local_1c8 + 0x70));
        }
        else {
          *iVar2._M_current = local_1c8._36_4_;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar2._M_current + 1;
        }
        local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_40 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x78))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        *(char *)uVar4 = '\x02';
        lVar13 = 0;
        local_1d8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this_00;
        local_1d0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)ppuVar1;
        do {
          uVar6 = (*(pointer *)local_1d0)[lVar13];
          local_158._0_4_ = uVar6;
          local_1dc = (*(pointer *)local_1d8)[lVar13];
          lVar18 = (ulong)((uVar6 - local_1c8._48_4_) + 1) +
                   (ulong)(((local_1dc - local_1c8._56_4_) + 1) * local_1c8._24_4_) +
                   CONCAT44(local_1c8._92_4_,local_1c8._88_4_);
          cVar21 = *(char *)(local_1c8._64_8_ + lVar18 + -1);
          pcVar19 = (char *)(lVar18 + local_1c8._64_8_);
          if (cVar21 != '\0') {
            if (cVar21 == '\x01') {
              local_1e0 = uVar6 - 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              local_1e0 = local_1dc - 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              pcVar19[-1] = '\x02';
            }
            cVar21 = '\x01';
          }
          if (*pcVar19 != '\0') {
            if (*pcVar19 == '\x01') {
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1d0,iVar2,(uint *)(local_1c8 + 0x70));
              }
              else {
                *iVar2._M_current = local_158._0_4_;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              local_1e0 = local_1dc - 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              *pcVar19 = '\x02';
            }
            cVar21 = cVar21 + '\x01';
          }
          pcVar20 = pcVar19 + 1;
          if (pcVar19[1] != '\0') {
            if (pcVar19[1] == '\x01') {
              local_1e0 = local_158._0_4_ + 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              local_1e0 = local_1dc - 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              *pcVar20 = '\x02';
            }
            cVar21 = cVar21 + '\x01';
          }
          pcVar19 = pcVar20 + uVar17;
          if (pcVar20[uVar17] != '\0') {
            if (pcVar20[uVar17] == '\x01') {
              local_1e0 = local_158._0_4_ - 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1d8,iVar2,&local_1dc);
              }
              else {
                *iVar2._M_current = local_1dc;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              *pcVar19 = '\x02';
            }
            cVar21 = cVar21 + '\x01';
          }
          pcVar20 = pcVar19 + 2;
          if (pcVar19[2] != '\0') {
            if (pcVar19[2] == '\x01') {
              local_1e0 = local_158._0_4_ + 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1d8,iVar2,&local_1dc);
              }
              else {
                *iVar2._M_current = local_1dc;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              *pcVar20 = '\x02';
            }
            cVar21 = cVar21 + '\x01';
          }
          pcVar19 = pcVar20 + uVar17;
          if (pcVar20[uVar17] != '\0') {
            if (pcVar20[uVar17] == '\x01') {
              local_1e0 = local_158._0_4_ - 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              local_1e0 = local_1dc + 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              *pcVar19 = '\x02';
            }
            cVar21 = cVar21 + '\x01';
          }
          if (pcVar19[1] != '\0') {
            if (pcVar19[1] == '\x01') {
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_1d0,iVar2,(uint *)(local_1c8 + 0x70));
              }
              else {
                *iVar2._M_current = local_158._0_4_;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              local_1e0 = local_1dc + 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              pcVar19[1] = '\x02';
            }
            cVar21 = cVar21 + '\x01';
          }
          if (pcVar19[2] != '\0') {
            if (pcVar19[2] == '\x01') {
              local_1e0 = local_158._0_4_ + 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x18))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              local_1e0 = local_1dc + 1;
              iVar2._M_current =
                   (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                           &local_1e0);
              }
              else {
                *iVar2._M_current = local_1e0;
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = iVar2._M_current + 1;
              }
              pcVar19[2] = '\x02';
            }
            cVar21 = cVar21 + '\x01';
          }
          if (cVar21 != '\b') {
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x78))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x78))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_38,iVar2,(uint *)(local_1c8 + 0x70));
            }
            else {
              *iVar2._M_current = local_158._0_4_;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x78))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            iVar2._M_current = *(uint **)&((Value<Blob_Detection::Area> *)(uVar3 + 0x90))->value;
            if (iVar2._M_current ==
                *(uint **)&(((Value<Blob_Detection::Area> *)(uVar3 + 0x90))->value).top) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_40,iVar2,&local_1dc);
            }
            else {
              *iVar2._M_current = local_1dc;
              *(uint **)&((Value<Blob_Detection::Area> *)(uVar3 + 0x90))->value =
                   iVar2._M_current + 1;
            }
            (pcVar19 + 1)[local_1c8._64_8_] = '\x03';
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (uVar3 + 0x18))->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start -
                           (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)uVar3)->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage >> 2);
        ppuVar1 = &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x30))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_158._0_4_ = local_1c8._84_4_;
        iVar2._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar2._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                     (uint *)(local_1c8 + 0x70));
        }
        else {
          *iVar2._M_current = local_1c8._84_4_;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar2._M_current + 1;
        }
        uVar4 = local_1c8._40_8_;
        local_1d8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_158._0_4_ = local_1c8._36_4_;
        iVar2._M_current =
             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if (iVar2._M_current ==
            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                     (uint *)(local_1c8 + 0x70));
        }
        else {
          *iVar2._M_current = local_1c8._36_4_;
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = iVar2._M_current + 1;
        }
        *(char *)uVar4 = '\x04';
        lVar13 = 0;
        do {
          uVar6 = (*ppuVar1)[lVar13];
          local_158._0_4_ = uVar6;
          local_1dc = (*(pointer *)local_1d8)[lVar13];
          lVar18 = (ulong)((uVar6 - local_1c8._48_4_) + 1) +
                   (ulong)(((local_1dc - local_1c8._56_4_) + 1) * local_1c8._24_4_) +
                   CONCAT44(local_1c8._92_4_,local_1c8._88_4_);
          pcVar19 = (char *)(lVar18 + local_1c8._64_8_);
          if (*(char *)(local_1c8._64_8_ + lVar18 + -1) == '\x03') {
            local_1e0 = uVar6 - 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            local_1e0 = local_1dc - 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            pcVar19[-1] = '\x04';
          }
          if (*pcVar19 == '\x03') {
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)ppuVar1,iVar2,
                         (uint *)(local_1c8 + 0x70));
            }
            else {
              *iVar2._M_current = local_158._0_4_;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            local_1e0 = local_1dc - 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            *pcVar19 = '\x04';
          }
          pcVar20 = pcVar19 + 1;
          if (pcVar19[1] == '\x03') {
            local_1e0 = local_158._0_4_ + 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            local_1e0 = local_1dc - 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            *pcVar20 = '\x04';
          }
          pcVar19 = pcVar20 + uVar17;
          if (pcVar20[uVar17] == '\x03') {
            local_1e0 = local_158._0_4_ - 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_1d8,iVar2,&local_1dc);
            }
            else {
              *iVar2._M_current = local_1dc;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            *pcVar19 = '\x04';
          }
          pcVar20 = pcVar19 + 2;
          if (pcVar19[2] == '\x03') {
            local_1e0 = local_158._0_4_ + 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_1d8,iVar2,&local_1dc);
            }
            else {
              *iVar2._M_current = local_1dc;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            *pcVar20 = '\x04';
          }
          if (pcVar20[uVar17] == '\x03') {
            local_1e0 = local_158._0_4_ - 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            local_1e0 = local_1dc + 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            pcVar20[uVar17] = '\x04';
          }
          if (pcVar19[uVar17 + 3] == '\x03') {
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)ppuVar1,iVar2,
                         (uint *)(local_1c8 + 0x70));
            }
            else {
              *iVar2._M_current = local_158._0_4_;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            local_1e0 = local_1dc + 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            pcVar19[uVar17 + 3] = '\x04';
          }
          if (pcVar19[uVar17 + 4] == '\x03') {
            local_1e0 = local_158._0_4_ + 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x48))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            local_1e0 = local_1dc + 1;
            iVar2._M_current =
                 (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,iVar2,
                         &local_1e0);
            }
            else {
              *iVar2._M_current = local_1e0;
              (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(uVar3 + 0x60))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = iVar2._M_current + 1;
            }
            pcVar19[uVar17 + 4] = '\x04';
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (uVar3 + 0x48))->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start -
                           (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (uVar3 + 0x30))->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage >> 2);
      }
      puVar7 = (pointer)(local_1c8._40_8_ + 1);
    } while (puVar7 != local_48);
  }
  pBVar11 = (pointer)(local_1c8 + 0x70);
  pBVar10 = (pointer)local_1c8._0_8_;
  if ((parameter.circularity.checkMaximum != false) || (parameter.circularity.checkMinimum == true))
  {
    for (; pBVar10 != (pointer)local_1c8;
        pBVar10 = (pointer)(pBVar10->_pointX).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) {
      BlobInfo::_getCircularity
                ((BlobInfo *)
                 &(pBVar10->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar10 = (pointer)local_1c8._0_8_;
    local_158._0_8_ = pBVar11;
    local_158._8_8_ = pBVar11;
    while (pBVar9 = pBVar10, pBVar9 != (pointer)local_1c8) {
      pBVar10 = (pointer)(pBVar9->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      if ((((parameter.circularity.checkMaximum == true) &&
           (parameter.circularity.maximum < (pBVar9->_elongation).value)) ||
          ((parameter.circularity.checkMinimum == true &&
           ((pBVar9->_elongation).value < parameter.circularity.minimum)))) &&
         (pBVar10 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar9)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar9);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c8._16_8_ = local_1c8._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             (local_1c8 + 0x70));
  }
  pBVar10 = (pointer)local_1c8._0_8_;
  if ((parameter.elongation.checkMaximum != false) || (parameter.elongation.checkMinimum == true)) {
    for (; pBVar10 != (pointer)local_1c8;
        pBVar10 = (pointer)(pBVar10->_pointX).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) {
      BlobInfo::_getElongation
                ((BlobInfo *)
                 &(pBVar10->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar10 = (pointer)local_1c8._0_8_;
    local_158._0_8_ = pBVar11;
    local_158._8_8_ = pBVar11;
    while (pBVar9 = pBVar10, pBVar9 != (pointer)local_1c8) {
      pBVar10 = (pointer)(pBVar9->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      if ((((parameter.elongation.checkMaximum == true) &&
           (parameter.elongation.maximum < (double)pBVar9->_height)) ||
          ((parameter.elongation.checkMinimum == true &&
           ((double)pBVar9->_height < parameter.elongation.minimum)))) &&
         (pBVar10 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar9)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar9);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c8._16_8_ = local_1c8._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             (local_1c8 + 0x70));
  }
  pBVar10 = (pointer)local_1c8._0_8_;
  if ((parameter.height.checkMaximum != false) || (parameter.height.checkMinimum == true)) {
    for (; pBVar10 != (pointer)local_1c8;
        pBVar10 = (pointer)(pBVar10->_pointX).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) {
      BlobInfo::_getHeight
                ((BlobInfo *)
                 &(pBVar10->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar10 = (pointer)local_1c8._0_8_;
    local_158._0_8_ = pBVar11;
    local_158._8_8_ = pBVar11;
    while (pBVar9 = pBVar10, pBVar9 != (pointer)local_1c8) {
      pBVar10 = (pointer)(pBVar9->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      if ((((parameter.height.checkMaximum == true) &&
           (parameter.height.maximum < *(uint *)&(pBVar9->_length).found)) ||
          ((parameter.height.checkMinimum == true &&
           (*(uint *)&(pBVar9->_length).found < parameter.height.minimum)))) &&
         (pBVar10 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar9)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar9);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c8._16_8_ = local_1c8._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             (local_1c8 + 0x70));
  }
  pBVar10 = (pointer)local_1c8._0_8_;
  if ((parameter.length.checkMaximum != false) || (parameter.length.checkMinimum == true)) {
    for (; pBVar10 != (pointer)local_1c8;
        pBVar10 = (pointer)(pBVar10->_pointX).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) {
      BlobInfo::_getLength
                ((BlobInfo *)
                 &(pBVar10->_pointX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar10 = (pointer)local_1c8._0_8_;
    local_158._0_8_ = pBVar11;
    local_158._8_8_ = pBVar11;
    while (pBVar9 = pBVar10, pBVar9 != (pointer)local_1c8) {
      pBVar10 = (pointer)(pBVar9->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      if ((((parameter.length.checkMaximum == true) &&
           (parameter.length.maximum < (double)pBVar9->_width)) ||
          ((parameter.length.checkMinimum == true &&
           ((double)pBVar9->_width < parameter.length.minimum)))) &&
         (pBVar10 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar9)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar9);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c8._16_8_ = local_1c8._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             (local_1c8 + 0x70));
  }
  if ((parameter.size.checkMaximum != false) || (parameter.size.checkMinimum == true)) {
    local_158._16_8_ = (pointer)0x0;
    pBVar10 = (pointer)local_1c8._0_8_;
    local_158._0_8_ = pBVar11;
    local_158._8_8_ = pBVar11;
    while (pBVar9 = pBVar10, pBVar9 != (pointer)local_1c8) {
      pBVar10 = (pointer)(pBVar9->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      if ((((parameter.size.checkMaximum == true) &&
           ((ulong)parameter.size.maximum <
            (ulong)((long)(pBVar9->_pointY).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)(pBVar9->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage >> 2))) ||
          ((parameter.size.checkMinimum == true &&
           ((ulong)((long)(pBVar9->_pointY).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)(pBVar9->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage >> 2) <
            (ulong)parameter.size.minimum)))) &&
         (pBVar10 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar9)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar9);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c8._16_8_ = local_1c8._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             (local_1c8 + 0x70));
  }
  pBVar10 = (pointer)local_1c8._0_8_;
  if ((parameter.width.checkMaximum != false) || (parameter.width.checkMinimum == true)) {
    for (; pBVar10 != (pointer)local_1c8;
        pBVar10 = (pointer)(pBVar10->_pointX).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) {
      BlobInfo::_getWidth((BlobInfo *)
                          &(pBVar10->_pointX).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    }
    local_158._16_8_ = (pointer)0x0;
    pBVar10 = (pointer)local_1c8._0_8_;
    local_158._0_8_ = pBVar11;
    local_158._8_8_ = pBVar11;
    while (pBVar11 = pBVar10, pBVar11 != (pointer)local_1c8) {
      pBVar10 = (pointer)(pBVar11->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      if ((((parameter.width.checkMaximum == true) &&
           (parameter.width.maximum <
            *(uint *)&pBVar11[1]._pointX.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish)) ||
          ((parameter.width.checkMinimum == true &&
           (*(uint *)&pBVar11[1]._pointX.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish < parameter.width.minimum)))) &&
         (pBVar10 != (pointer)local_158._0_8_ && (pointer)local_158._0_8_ != pBVar11)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_158._0_8_,(_List_node_base *)pBVar11);
        local_158._16_8_ =
             (long)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158._16_8_)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1;
        local_1c8._16_8_ = local_1c8._16_8_ + -1;
      }
    }
    std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
    _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             (local_1c8 + 0x70));
  }
  std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
  vector<std::_List_iterator<Blob_Detection::BlobInfo>,void>
            ((vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>> *)
             (local_1c8 + 0x70),(_List_iterator<Blob_Detection::BlobInfo>)local_1c8._0_8_,
             (_List_node_base *)local_1c8,(allocator_type *)&local_1dc);
  pBVar5 = local_50;
  pBVar11 = (local_50->_blob).
            super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_50->_blob).
  super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_158._16_8_;
  pBVar10 = (local_50->_blob).
            super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pBVar9 = (local_50->_blob).
           super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (local_50->_blob).
  super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_158._0_8_;
  (local_50->_blob).
  super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_158._8_8_;
  local_158._0_8_ = pBVar10;
  local_158._8_8_ = pBVar9;
  local_158._16_8_ = pBVar11;
  std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
            ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             (local_1c8 + 0x70));
  std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
  _M_clear((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
           local_1c8);
  if ((void *)CONCAT44(local_1c8._92_4_,local_1c8._88_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_1c8._92_4_,local_1c8._88_4_));
  }
  return &pBVar5->_blob;
}

Assistant:

const std::vector < BlobInfo > & BlobDetection::find( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width,
                                                          uint32_t height, BlobParameters parameter, uint8_t threshold )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );

        parameter._verify();

        _blob.clear();

        // we make the area by 2 pixels bigger in each direction so we don't need to check borders of map
        std::vector < uint8_t > imageMap( (width + 2) * (height + 2), EMPTY );

        uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        const uint32_t mapWidth = width + 2;

        std::vector < uint8_t >::iterator mapValueX = imageMap.begin() + mapWidth + 1;

        for( ; imageY != imageYEnd; imageY += rowSize, mapValueX += mapWidth ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint8_t >::iterator mapValueY = mapValueX;

            for( ; imageX != imageXEnd; ++imageX, ++mapValueY ) {
                if( (*imageX) >= threshold )
                    *mapValueY = NOT_IN_USE;
            }
        }

        // find all blobs
        std::list < BlobInfo > foundBlob;

        mapValueX = imageMap.begin() + mapWidth;
        std::vector < uint8_t >::const_iterator endMap = imageMap.end() - mapWidth;

        for( ; mapValueX != endMap; ++mapValueX ) {
            if( *mapValueX == NOT_IN_USE ) { // blob found!
                foundBlob.push_back( BlobInfo() );

                BlobInfo & newBlob = foundBlob.back();

                uint32_t relativePosition = static_cast<uint32_t>(mapValueX - imageMap.begin());

                std::vector < uint32_t > & pointX = newBlob._pointX;
                std::vector < uint32_t > & pointY = newBlob._pointY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                pointX.push_back( relativePosition % mapWidth + x - 1 );
                pointY.push_back( relativePosition / mapWidth + y - 1 );

                std::vector < uint32_t > & edgeX = newBlob._edgeX;
                std::vector < uint32_t > & edgeY = newBlob._edgeY;

                *mapValueX = FOUND;

                size_t pointId = 0;

                do {
                    uint32_t xMap = pointX[pointId];
                    uint32_t yMap = pointY[pointId++];

                    uint8_t neighbourCount = 0;

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + 2;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    if( neighbourCount != 8 ) {
                        edgeX.push_back( xMap );
                        edgeY.push_back( yMap );
                        *(position - 1 - mapWidth) = EDGE;
                    }
                } while( pointId != pointX.size() );

                // Now we can extract outer edge points or so called contour points
                std::vector < uint32_t > & contourX = newBlob._contourX;
                std::vector < uint32_t > & contourY = newBlob._contourY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                contourX.push_back( relativePosition % mapWidth + x - 1 );
                contourY.push_back( relativePosition / mapWidth + y - 1 );

                pointId = 0;

                *mapValueX = CONTOUR;

                do {
                    uint32_t xMap = contourX[pointId];
                    uint32_t yMap = contourY[pointId++];

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + 2;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }
                } while( pointId != contourX.size() );
            }
        }

        // All blobs found. Now we need to sort them
        if( parameter.circularity.checkMaximum || parameter.circularity.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getCircularity(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.circularity.checkMaximum && info.circularity() > parameter.circularity.maximum) ||
                       (parameter.circularity.checkMinimum && info.circularity() < parameter.circularity.minimum); } );
        }

        if( parameter.elongation.checkMaximum || parameter.elongation.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getElongation(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.elongation.checkMaximum && info.elongation() > parameter.elongation.maximum) ||
                       (parameter.elongation.checkMinimum && info.elongation() < parameter.elongation.minimum); } );
        }

        if( parameter.height.checkMaximum || parameter.height.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getHeight(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.height.checkMaximum && info.height() > parameter.height.maximum) ||
                       (parameter.height.checkMinimum && info.height() < parameter.height.minimum); } );
        }

        if( parameter.length.checkMaximum || parameter.length.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getLength(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.length.checkMaximum && info.length() > parameter.length.maximum) ||
                       (parameter.length.checkMinimum && info.length() < parameter.length.minimum); } );
        }

        if( parameter.size.checkMaximum || parameter.size.checkMinimum ) {
            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.size.checkMaximum && info.size() > parameter.size.maximum) ||
                       (parameter.size.checkMinimum && info.size() < parameter.size.minimum); } );
        }

        if( parameter.width.checkMaximum || parameter.width.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getWidth(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.width.checkMaximum && info.width() > parameter.width.maximum) ||
                       (parameter.width.checkMinimum && info.width() < parameter.width.minimum); } );
        }

        // prepare data for output
        std::vector <BlobInfo> blobTemp ( foundBlob.begin(), foundBlob.end() );
        std::swap( _blob, blobTemp );

        return get();
    }